

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86formatter.cpp
# Opt level: O1

Error asmjit::v1_14::x86::FormatterInternal_formatImmText
                (String *sb,uint32_t imm8,uint32_t bits,uint32_t advance,char *text,uint32_t count)

{
  char cVar1;
  Error EVar2;
  Error EVar3;
  uint uVar4;
  char *str;
  int iVar5;
  uint32_t i;
  uint uVar6;
  Error unaff_R13D;
  
  iVar5 = 0;
  for (uVar6 = 0; uVar6 != count; uVar6 = uVar6 + 1) {
    EVar2 = String::_opChar(sb,kAppend,'|' - (uVar6 == 0));
    uVar4 = 0;
    if (EVar2 == 0) {
      str = text;
      for (; uVar4 != (imm8 & ~(-1 << ((byte)bits & 0x1f))) + iVar5; uVar4 = uVar4 + 1) {
        do {
          cVar1 = *str;
          str = str + 1;
        } while (cVar1 != '\0');
      }
      EVar3 = String::_opString(sb,kAppend,str,0xffffffffffffffff);
      uVar4 = (uint)(EVar3 == 0);
      EVar2 = unaff_R13D;
      if (EVar3 != 0) {
        EVar2 = EVar3;
      }
    }
    unaff_R13D = EVar2;
    if ((char)uVar4 == '\0') break;
    imm8 = imm8 >> ((byte)bits & 0x1f);
    iVar5 = iVar5 + advance;
  }
  if (uVar6 < count) {
    return unaff_R13D;
  }
  EVar2 = String::_opChar(sb,kAppend,'}');
  return EVar2;
}

Assistant:

ASMJIT_FAVOR_SIZE static Error FormatterInternal_formatImmText(String& sb, uint32_t imm8, uint32_t bits, uint32_t advance, const char* text, uint32_t count = 1) noexcept {
  uint32_t mask = (1u << bits) - 1;
  uint32_t pos = 0;

  for (uint32_t i = 0; i < count; i++, imm8 >>= bits, pos += advance) {
    uint32_t value = (imm8 & mask) + pos;
    ASMJIT_PROPAGATE(sb.append(i == 0 ? kImmCharStart : kImmCharOr));
    ASMJIT_PROPAGATE(sb.append(Support::findPackedString(text, value)));
  }

  return sb.append(kImmCharEnd);
}